

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::SetCameraDirection(ON_Viewport *this,ON_3dVector *v)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  ON_3dVector local_38;
  
  if (this->m_bLockCamDir == true) {
    local_38.z = (this->m_CamDir).z;
    local_38.x = (this->m_CamDir).x;
    local_38.y = (this->m_CamDir).y;
    bVar3 = ON_3dVector::IsValid(&local_38);
    if (bVar3) {
      dVar1 = ON_3dVector::MaximumCoordinate(&local_38);
      if ((dVar1 < 1e+100) && (2.3283064365386963e-10 < dVar1)) {
        bVar4 = ON_3dVector::operator==(v,&this->m_CamDir);
        goto LAB_006658b4;
      }
    }
  }
  bVar3 = ON_3dVector::operator==(v,&ON_3dVector::UnsetVector);
  if (bVar3) {
    (this->m_CamDir).z = ON_3dVector::UnsetVector.z;
    dVar1 = ON_3dVector::UnsetVector.y;
    (this->m_CamDir).x = ON_3dVector::UnsetVector.x;
    (this->m_CamDir).y = dVar1;
    *(undefined4 *)((this->m_projection_content_sha1).m_digest + 0x10) =
         ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
    uVar2 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
    *(undefined8 *)(this->m_projection_content_sha1).m_digest =
         ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
    *(undefined8 *)((this->m_projection_content_sha1).m_digest + 8) = uVar2;
    bVar4 = 0;
    this->m_bValidCameraFrame = false;
    this->m_bValidCamera = false;
  }
  else {
    (this->m_CamDir).z = v->z;
    dVar1 = v->y;
    (this->m_CamDir).x = v->x;
    (this->m_CamDir).y = dVar1;
    SetCameraFrame(this);
    bVar4 = this->m_bValidCamera;
  }
LAB_006658b4:
  return (bool)(bVar4 & 1);
}

Assistant:

bool ON_Viewport::SetCameraDirection( const ON_3dVector& v )
{
  if ( m_bLockCamDir && ON_Viewport::IsValidCameraUpOrDirection(m_CamDir) )
  {
    return (v == m_CamDir);
  }

  if (v == ON_3dVector::UnsetVector)
  {
    m_CamDir = ON_3dVector::UnsetVector;
    m_projection_content_sha1 = ON_SHA1_Hash::ZeroDigest;
    m_bValidCameraFrame = false;
    m_bValidCamera = false;
  }
  else
  {
    m_CamDir = v;
    SetCameraFrame();
  }

  return m_bValidCamera;
}